

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O3

int sam_hdr_link_pg(SAM_hdr *hdr)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  kh_m_s2i_t *pkVar4;
  khint32_t *pkVar5;
  undefined1 auVar6 [16];
  char cVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int *piVar11;
  byte bVar12;
  char *pcVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  SAM_hdr_tag *pSVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  hdr->npg_end_alloc = hdr->npg;
  piVar11 = (int *)realloc(hdr->pg_end,(long)hdr->npg << 2);
  hdr->pg_end = piVar11;
  auVar6 = _DAT_001470c0;
  if (piVar11 == (int *)0x0) {
    iVar8 = -1;
  }
  else {
    iVar8 = hdr->npg;
    if (0 < (long)iVar8) {
      lVar18 = (long)iVar8 + -1;
      auVar22._8_4_ = (int)lVar18;
      auVar22._0_8_ = lVar18;
      auVar22._12_4_ = (int)((ulong)lVar18 >> 0x20);
      uVar17 = 0;
      auVar22 = auVar22 ^ _DAT_001470c0;
      auVar23 = _DAT_001470b0;
      do {
        auVar24 = auVar23 ^ auVar6;
        if ((bool)(~(auVar24._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar24._0_4_ ||
                    auVar22._4_4_ < auVar24._4_4_) & 1)) {
          piVar11[uVar17] = (int)uVar17;
        }
        if ((auVar24._12_4_ != auVar22._12_4_ || auVar24._8_4_ <= auVar22._8_4_) &&
            auVar24._12_4_ <= auVar22._12_4_) {
          piVar11[uVar17 + 1] = (int)uVar17 + 1;
        }
        uVar17 = uVar17 + 2;
        lVar18 = auVar23._8_8_;
        auVar23._0_8_ = auVar23._0_8_ + 2;
        auVar23._8_8_ = lVar18 + 2;
      } while ((iVar8 + 1U & 0xfffffffe) != uVar17);
      if (0 < iVar8) {
        lVar18 = 0;
        iVar8 = 0;
        do {
          pSVar21 = hdr->pg[lVar18].tag;
LAB_0013990a:
          iVar20 = iVar8;
          if (pSVar21 == (SAM_hdr_tag *)0x0) goto LAB_00139aaa;
          pcVar3 = pSVar21->str;
          if ((*pcVar3 != 'P') || (pcVar3[1] != 'P')) goto LAB_00139922;
          cVar1 = pcVar3[pSVar21->len];
          pcVar3[pSVar21->len] = '\0';
          pkVar4 = hdr->pg_hash;
          pcVar3 = pSVar21->str;
          uVar14 = pkVar4->n_buckets;
          if (uVar14 == 0) {
            uVar14 = 0;
            goto LAB_00139a62;
          }
          cVar7 = pcVar3[3];
          uVar16 = (uint)cVar7;
          if (cVar7 == '\0') {
            uVar16 = 0;
          }
          else {
            cVar7 = pcVar3[4];
            if (cVar7 != '\0') {
              pcVar13 = pcVar3 + 5;
              do {
                uVar16 = (int)cVar7 + uVar16 * 0x1f;
                cVar7 = *pcVar13;
                pcVar13 = pcVar13 + 1;
              } while (cVar7 != '\0');
            }
          }
          uVar16 = uVar16 & uVar14 - 1;
          pkVar5 = pkVar4->flags;
          iVar20 = 1;
          uVar19 = uVar16;
          do {
            uVar2 = pkVar5[uVar19 >> 4];
            bVar12 = (char)uVar19 * '\x02' & 0x1e;
            uVar9 = uVar2 >> bVar12;
            if (((uVar9 & 2) != 0) ||
               (((uVar9 & 1) == 0 && (iVar10 = strcmp(pkVar4->keys[uVar19],pcVar3 + 3), iVar10 == 0)
                ))) {
              if ((uVar2 >> bVar12 & 3) == 0) {
                uVar14 = uVar19;
              }
              break;
            }
            uVar19 = uVar19 + iVar20 & uVar14 - 1;
            iVar20 = iVar20 + 1;
          } while (uVar19 != uVar16);
LAB_00139a62:
          pcVar3[pSVar21->len] = cVar1;
          iVar20 = -1;
          if (uVar14 != hdr->pg_hash->n_buckets) {
            piVar11 = hdr->pg_hash->vals;
            hdr->pg[lVar18].prev_id = hdr->pg[piVar11[uVar14]].id;
            hdr->pg_end[piVar11[uVar14]] = -1;
            iVar20 = iVar8;
          }
LAB_00139aaa:
          iVar8 = iVar20;
          lVar18 = lVar18 + 1;
          uVar17 = (ulong)hdr->npg;
          if ((long)uVar17 <= lVar18) {
            if (hdr->npg < 1) goto LAB_00139aee;
            piVar11 = hdr->pg_end;
            lVar18 = 0;
            iVar20 = 0;
            do {
              iVar10 = piVar11[lVar18];
              if (iVar10 != -1) {
                lVar15 = (long)iVar20;
                iVar20 = iVar20 + 1;
                piVar11[lVar15] = iVar10;
                uVar17 = (ulong)(uint)hdr->npg;
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < (int)uVar17);
            goto LAB_00139af0;
          }
        } while( true );
      }
    }
    iVar8 = 0;
LAB_00139aee:
    iVar20 = 0;
LAB_00139af0:
    hdr->npg_end = iVar20;
  }
  return iVar8;
LAB_00139922:
  pSVar21 = pSVar21->next;
  goto LAB_0013990a;
}

Assistant:

int sam_hdr_link_pg(SAM_hdr *hdr) {
    int i, j, ret = 0;

    hdr->npg_end_alloc = hdr->npg;
    hdr->pg_end = realloc(hdr->pg_end, hdr->npg * sizeof(*hdr->pg_end));
    if (!hdr->pg_end)
	return -1;

    for (i = 0; i < hdr->npg; i++)
	hdr->pg_end[i] = i;

    for (i = 0; i < hdr->npg; i++) {
	khint_t k;
	SAM_hdr_tag *tag;
	char tmp;

	for (tag = hdr->pg[i].tag; tag; tag = tag->next) {
	    if (tag->str[0] == 'P' && tag->str[1] == 'P')
		break;
	}
	if (!tag) {
	    /* Chain start points */
	    continue;
	}

	tmp = tag->str[tag->len]; tag->str[tag->len] = 0;
	k = kh_get(m_s2i, hdr->pg_hash, tag->str+3);
	tag->str[tag->len] = tmp;

	if (k == kh_end(hdr->pg_hash)) {
	    ret = -1;
	    continue;
	}

	hdr->pg[i].prev_id = hdr->pg[kh_val(hdr->pg_hash, k)].id;
	hdr->pg_end[kh_val(hdr->pg_hash, k)] = -1;
    }

    for (i = j = 0; i < hdr->npg; i++) {
	if (hdr->pg_end[i] != -1)
	    hdr->pg_end[j++] = hdr->pg_end[i];
    }
    hdr->npg_end = j;

    return ret;
}